

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

void __thiscall clickhouse::ColumnFixedString::Append(ColumnFixedString *this,ColumnRef *column)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<clickhouse::Column,void>
            ((__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (__weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> *)
             &((column->super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->super_enable_shared_from_this<clickhouse::Column>);
  if (local_28 == 0) {
    lVar1 = 0;
  }
  else {
    lVar1 = __dynamic_cast(local_28,&Column::typeinfo,&typeinfo,0);
  }
  if (lVar1 == 0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar1 = 0;
  }
  else {
    this_00 = local_20;
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_20->_M_use_count = local_20->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_20->_M_use_count = local_20->_M_use_count + 1;
      }
    }
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if ((lVar1 != 0) && (this->string_size_ == *(size_t *)(lVar1 + 0x28))) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->data_,
               (this->data_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)(lVar1 + 0x30),
               *(undefined8 *)(lVar1 + 0x38));
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void ColumnFixedString::Append(ColumnRef column) {
    if (auto col = column->As<ColumnFixedString>()) {
        if (string_size_ == col->string_size_) {
            data_.insert(data_.end(), col->data_.begin(), col->data_.end());
        }
    }
}